

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O0

Intersection * __thiscall Parallelepiped::intersects(Parallelepiped *this,Ray *r)

{
  reference ppTVar1;
  Intersection *pIVar2;
  int local_2c;
  int t;
  Intersection *tmp;
  Intersection *i;
  Ray *r_local;
  Parallelepiped *this_local;
  
  tmp = (Intersection *)0x0;
  for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
    ppTVar1 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::at
                        (&this->triangles,(long)local_2c);
    pIVar2 = Triangle::intersects(*ppTVar1,r);
    if (pIVar2 != (Intersection *)0x0) {
      tmp = pIVar2;
    }
  }
  return tmp;
}

Assistant:

Intersection *Parallelepiped::intersects(Ray &r) {
    Intersection *i = NULL, *tmp;
    
    for(int t = 0; t < N_TRIANGLES; ++t) {
        if( tmp = triangles.at(t)->intersects(r) ) {
            i = tmp;
        }
    }
    return i;
}